

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5InterrogatorStatus *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mode5InterrogatorStatus *local_18;
  Mode5InterrogatorStatus *this_local;
  
  local_18 = this;
  this_local = (Mode5InterrogatorStatus *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Interrogator Status:");
  poVar1 = std::operator<<(poVar1,"\n\tIFF Mission:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_StatusUnion).m_ui8Status & 7);
  poVar1 = std::operator<<(poVar1,"\n\tMessage Format: ");
  ENUMS::GetEnumAsStringMode5MessageFormat_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_StatusUnion).m_ui8Status >> 3 & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tOn/Off Status:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->m_StatusUnion).m_ui8Status >> 5 & 1));
  poVar1 = std::operator<<(poVar1,"\n\tDamaged:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->m_StatusUnion).m_ui8Status >> 6 & 1));
  poVar1 = std::operator<<(poVar1,"\n\tMalfunction:    ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(bool)((this->m_StatusUnion).m_ui8Status >> 7));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5InterrogatorStatus::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Interrogator Status:"
	   << "\n\tIFF Mission:    " << ( KUINT16 )m_StatusUnion.m_ui8IffMis
	   << "\n\tMessage Format: " << GetEnumAsStringMode5MessageFormat( m_StatusUnion.m_ui8MsgFrmt )
	   << "\n\tOn/Off Status:  " << ( KBOOL )m_StatusUnion.m_ui8OnOff
	   << "\n\tDamaged:        " << ( KBOOL )m_StatusUnion.m_ui8Dmg 
	   << "\n\tMalfunction:    " << ( KBOOL )m_StatusUnion.m_ui8MalFnc
	   << "\n";

    return ss.str();
}